

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O0

bool __thiscall BaseIndex::StartBackgroundSync(BaseIndex *this)

{
  long lVar1;
  bool bVar2;
  logic_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  BaseIndex *in_stack_ffffffffffffffa8;
  thread *__t;
  thread *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_1;
  code *__f;
  thread in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __args_1 = in_RDI;
  bVar2 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_RDI);
  if (bVar2) {
    __f = util::TraceThread;
    GetName_abi_cxx11_(in_stack_ffffffffffffffa8);
    __t = (thread *)&stack0xfffffffffffffff0;
    std::thread::
    thread<void(*)(std::basic_string_view<char,std::char_traits<char>>,std::function<void()>),std::__cxx11::string_const&,BaseIndex::StartBackgroundSync()::__0,void>
              ((thread *)in_stack_fffffffffffffff0._M_id._M_thread,
               (_func_void_basic_string_view<char,_std::char_traits<char>_>_function<void_()> **)__f
               ,in_RDI,(type *)__args_1);
    std::thread::operator=(in_stack_ffffffffffffffb8,__t);
    std::thread::~thread((thread *)in_stack_ffffffffffffffa8);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return true;
    }
  }
  else {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"Error: Cannot start a non-initialized index");
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

bool BaseIndex::StartBackgroundSync()
{
    if (!m_init) throw std::logic_error("Error: Cannot start a non-initialized index");

    m_thread_sync = std::thread(&util::TraceThread, GetName(), [this] { Sync(); });
    return true;
}